

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManComputeFirstArray(If_DsdMan_t *p,int *pLits,int nLits,int *pFirsts)

{
  int iVar1;
  int local_30;
  int local_2c;
  int nSSize;
  int i;
  int *pFirsts_local;
  int nLits_local;
  int *pLits_local;
  If_DsdMan_t *p_local;
  
  local_30 = 0;
  for (local_2c = 0; local_2c < nLits; local_2c = local_2c + 1) {
    pFirsts[local_2c] = local_30;
    iVar1 = If_DsdVecLitSuppSize(&p->vObjs,pLits[local_2c]);
    local_30 = iVar1 + local_30;
  }
  return local_30;
}

Assistant:

int If_DsdManComputeFirstArray( If_DsdMan_t * p, int * pLits, int nLits, int * pFirsts )
{
    int i, nSSize = 0;
    for ( i = 0; i < nLits; i++ )
    {
        pFirsts[i] = nSSize;
        nSSize += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    return nSSize;
}